

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O0

NodeAndBucket __thiscall
google::protobuf::internal::UntypedMapBase::FindFromTree
          (UntypedMapBase *this,map_index_t b,VariantKey key,iterator *it)

{
  bool bVar1;
  pointer ppVar2;
  iterator iVar3;
  NodeAndBucket NVar4;
  iterator local_78;
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *local_68;
  int local_60;
  undefined1 local_58 [8];
  iterator tree_it;
  Tree *tree;
  iterator *it_local;
  map_index_t b_local;
  UntypedMapBase *this_local;
  VariantKey key_local;
  
  key_local.data = (char *)key.integral;
  this_local = (UntypedMapBase *)key.data;
  tree_it._8_8_ = TableEntryToTree(this->table_[b]);
  iVar3 = absl::lts_20240722::container_internal::
          btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>_>
          ::find<google::protobuf::internal::VariantKey>
                    ((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>_>
                      *)tree_it._8_8_,(key_arg<google::protobuf::internal::VariantKey> *)&this_local
                    );
  local_68 = iVar3.node_;
  local_60 = iVar3.position_;
  if (it != (iterator *)0x0) {
    it->node_ = local_68;
    it->position_ = local_60;
  }
  local_58 = (undefined1  [8])local_68;
  tree_it.node_._0_4_ = local_60;
  iVar3 = absl::lts_20240722::container_internal::
          btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>_>
          ::end((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>_>
                 *)tree_it._8_8_);
  local_78.node_ = iVar3.node_;
  local_78.position_ = iVar3.position_;
  bVar1 = absl::lts_20240722::container_internal::
          btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
          ::operator!=((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
                        *)local_58,&local_78);
  if (bVar1) {
    ppVar2 = absl::lts_20240722::container_internal::
             btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
             ::operator->((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
                           *)local_58);
    key_local.integral = (uint64_t)ppVar2->second;
  }
  else {
    key_local.integral = 0;
  }
  NVar4.bucket = b;
  NVar4.node = (NodeBase *)key_local.integral;
  NVar4._12_4_ = 0;
  return NVar4;
}

Assistant:

auto UntypedMapBase::FindFromTree(map_index_t b, VariantKey key,
                                  Tree::iterator* it) const -> NodeAndBucket {
  Tree* tree = TableEntryToTree(table_[b]);
  auto tree_it = tree->find(key);
  if (it != nullptr) *it = tree_it;
  if (tree_it != tree->end()) {
    return {tree_it->second, b};
  }
  return {nullptr, b};
}